

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

mdef_t * mdef_init(char *mdeffile,int32 breport)

{
  short sVar1;
  s3cipid_t sVar2;
  int32 iVar3;
  int iVar4;
  mdef_t *m_00;
  hash_table_t *phVar5;
  ciphone_t *pcVar6;
  phone_t *ppVar7;
  s3senid_t **ppsVar8;
  s3senid_t *psVar9;
  ph_lc_t ***ppppVar10;
  s3cipid_t *psVar11;
  bool bVar12;
  mdef_t *m;
  int32 cd;
  int32 ci;
  int32 s;
  s3pid_t p;
  s3senid_t **senmap;
  char buf [1024];
  char tag [1024];
  int local_30;
  int local_2c;
  int32 n;
  int32 n_map;
  int32 n_tri;
  int32 n_ci;
  FILE *fp;
  char *pcStack_10;
  int32 breport_local;
  char *mdeffile_local;
  
  fp._4_4_ = breport;
  pcStack_10 = mdeffile;
  if (mdeffile == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x2a8,"No mdef-file\n");
    exit(1);
  }
  if (breport != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x2ab,"Reading model definition: %s\n",mdeffile);
  }
  m_00 = (mdef_t *)
         __ckd_calloc__(1,0x68,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                        ,0x2ad);
  _n_tri = fopen(pcStack_10,"r");
  if (_n_tri == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                   ,0x2b0,"fopen(%s,r) failed\n",pcStack_10);
    exit(1);
  }
  iVar3 = noncomment_line((char *)&senmap,0x400,(FILE *)_n_tri);
  if (iVar3 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x2b3,"Empty file: %s\n",pcStack_10);
    exit(1);
  }
  iVar4 = strncmp((char *)&senmap,"0.3",3);
  if (iVar4 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x2b7,"Version error: Expecing %s, but read %s\n","0.3",&senmap);
    exit(1);
  }
  n_map = -1;
  n = -1;
  local_2c = -1;
  m_00->n_ci_sen = -1;
  m_00->n_sen = -1;
  m_00->n_tmat = -1;
  do {
    iVar3 = noncomment_line((char *)&senmap,0x400,(FILE *)_n_tri);
    if (iVar3 < 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2c2,"Incomplete header\n");
      exit(1);
    }
    iVar4 = __isoc99_sscanf(&senmap,"%d %s",&local_30,buf + 0x3f8);
    if ((iVar4 != 2) || (local_30 < 0)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2c5,"Error in header: %s\n",&senmap);
      exit(1);
    }
    iVar4 = strcmp(buf + 0x3f8,"n_base");
    if (iVar4 == 0) {
      n_map = local_30;
    }
    else {
      iVar4 = strcmp(buf + 0x3f8,"n_tri");
      if (iVar4 == 0) {
        n = local_30;
      }
      else {
        iVar4 = strcmp(buf + 0x3f8,"n_state_map");
        if (iVar4 == 0) {
          local_2c = local_30;
        }
        else {
          iVar4 = strcmp(buf + 0x3f8,"n_tied_ci_state");
          if (iVar4 == 0) {
            m_00->n_ci_sen = local_30;
          }
          else {
            iVar4 = strcmp(buf + 0x3f8,"n_tied_state");
            if (iVar4 == 0) {
              m_00->n_sen = local_30;
            }
            else {
              iVar4 = strcmp(buf + 0x3f8,"n_tied_tmat");
              if (iVar4 != 0) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                        ,0x2d4,"Unknown header line: %s\n",&senmap);
                exit(1);
              }
              m_00->n_tmat = local_30;
            }
          }
        }
      }
    }
    bVar12 = true;
    if ((((-1 < n_map) && (bVar12 = true, -1 < n)) && (bVar12 = true, -1 < local_2c)) &&
       ((bVar12 = true, -1 < m_00->n_ci_sen && (bVar12 = true, -1 < m_00->n_sen)))) {
      bVar12 = m_00->n_tmat < 0;
    }
  } while (bVar12);
  if (((n_map == 0) || (m_00->n_ci_sen == 0)) ||
     ((m_00->n_tmat == 0 || (m_00->n_sen < m_00->n_ci_sen)))) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x2da,"%s: Error in header\n",pcStack_10);
    exit(1);
  }
  if (0x7ffe < n_map) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x2df,"%s: #CI phones (%d) exceeds limit (%d)\n",pcStack_10,(ulong)(uint)n_map,0x7fff);
    exit(1);
  }
  if (n_map + n < 0x7ffffffe) {
    if (0x7ffd < m_00->n_sen) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2e5,"%s: #senones (%d) exceeds limit (%d)\n",pcStack_10,(ulong)(uint)m_00->n_sen,
              0x7ffe);
      exit(1);
    }
    if (0x7ffffffd < m_00->n_tmat) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2e8,"%s: #tmats (%d) exceeds limit (%d)\n",pcStack_10,(ulong)(uint)m_00->n_tmat,
              0x7ffffffe);
      exit(1);
    }
    m_00->n_emit_state = local_2c / (n_map + n) + -1;
    if ((m_00->n_emit_state + 1) * (n_map + n) != local_2c) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2ed,"Header error: n_state_map not a multiple of n_ci*n_tri\n");
      exit(1);
    }
    m_00->n_ciphone = n_map;
    phVar5 = hash_table_new(n_map,0);
    m_00->ciphone_ht = phVar5;
    pcVar6 = (ciphone_t *)
             __ckd_calloc__((long)n_map,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                            ,0x2f2);
    m_00->ciphone = pcVar6;
    m_00->n_phone = n_map + n;
    ppVar7 = (phone_t *)
             __ckd_calloc__((long)m_00->n_phone,0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                            ,0x2f6);
    m_00->phone = ppVar7;
    ppsVar8 = (s3senid_t **)
              __ckd_calloc_2d__((long)m_00->n_phone,(long)m_00->n_emit_state,2,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                ,0x2f9);
    m_00->sseq = ppsVar8;
    psVar9 = (s3senid_t *)
             __ckd_calloc__((long)(m_00->n_phone * m_00->n_emit_state),2,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                            ,0x30d);
    m_00->st2senmap = psVar9;
    for (ci = 0; ci < m_00->n_phone; ci = ci + 1) {
      m_00->phone[ci].state = m_00->st2senmap + ci * m_00->n_emit_state;
    }
    ppppVar10 = (ph_lc_t ***)
                __ckd_calloc_2d__(4,(long)m_00->n_ciphone,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                  ,0x314);
    m_00->wpos_ci_lclist = ppppVar10;
    for (ci = 0; ci < n_map; ci = ci + 1) {
      iVar3 = noncomment_line((char *)&senmap,0x400,(FILE *)_n_tri);
      if (iVar3 < 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,0x31e,"Premature EOF reading CIphone %d\n",(ulong)(uint)ci);
        exit(1);
      }
      parse_base_line(m_00,(char *)&senmap,ci);
    }
    sVar2 = mdef_ciphone_id(m_00,"SIL");
    m_00->sil = sVar2;
    for (; ci < m_00->n_phone; ci = ci + 1) {
      iVar3 = noncomment_line((char *)&senmap,0x400,(FILE *)_n_tri);
      if (iVar3 < 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,0x326,"Premature EOF reading phone %d\n",(ulong)(uint)ci);
        exit(1);
      }
      parse_tri_line(m_00,(char *)&senmap,ci);
    }
    iVar3 = noncomment_line((char *)&senmap,0x400,(FILE *)_n_tri);
    if (-1 < iVar3) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x32c,"Non-empty file beyond expected #phones (%d)\n",(ulong)(uint)m_00->n_phone);
    }
    if (m_00->n_ciphone * m_00->n_emit_state == m_00->n_ci_sen) {
      psVar9 = (s3senid_t *)
               __ckd_calloc__((long)m_00->n_sen,2,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                              ,0x333);
      m_00->cd2cisen = psVar9;
      psVar11 = (s3cipid_t *)
                __ckd_calloc__((long)m_00->n_sen,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                               ,0x335);
      m_00->sen2cimap = psVar11;
      for (cd = 0; cd < m_00->n_sen; cd = cd + 1) {
        m_00->sen2cimap[cd] = -1;
      }
      for (cd = 0; cd < m_00->n_ci_sen; cd = cd + 1) {
        m_00->cd2cisen[cd] = (s3senid_t)cd;
        m_00->sen2cimap[cd] = (s3cipid_t)(cd / m_00->n_emit_state);
      }
      for (ci = n_map; ci < m_00->n_phone; ci = ci + 1) {
        for (cd = 0; cd < m_00->n_emit_state; cd = cd + 1) {
          sVar1 = m_00->sseq[ci][cd];
          m_00->cd2cisen[(int)sVar1] = m_00->sseq[(int)m_00->phone[ci].ci][cd];
          m_00->sen2cimap[(int)sVar1] = m_00->phone[ci].ci;
        }
      }
      sseq_compress(m_00);
      fclose(_n_tri);
      return m_00;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x332,"#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
            (ulong)(uint)m_00->n_ci_sen,(ulong)(uint)m_00->n_ciphone,m_00->n_emit_state);
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
          ,0x2e2,"%s: #Phones (%d) exceeds limit (%d)\n",pcStack_10,(ulong)(uint)(n_map + n),
          0x7ffffffe);
  exit(1);
}

Assistant:

mdef_t *
mdef_init(const char *mdeffile, int32 breport)
{
    FILE *fp;
    int32 n_ci, n_tri, n_map, n;
    char tag[1024], buf[1024];
    s3senid_t **senmap;
    /*    s3senid_t *tempsenmap; */

    s3pid_t p;
    int32 s, ci, cd;
    mdef_t *m;

    if (!mdeffile)
        E_FATAL("No mdef-file\n");

    if (breport)
        E_INFO("Reading model definition: %s\n", mdeffile);

    m = (mdef_t *) ckd_calloc(1, sizeof(mdef_t));       /* freed in mdef_free */

    if ((fp = fopen(mdeffile, "r")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,r) failed\n", mdeffile);

    if (noncomment_line(buf, sizeof(buf), fp) < 0)
        E_FATAL("Empty file: %s\n", mdeffile);

    if (strncmp(buf, MODEL_DEF_VERSION, strlen(MODEL_DEF_VERSION)) != 0)
        E_FATAL("Version error: Expecing %s, but read %s\n",
                MODEL_DEF_VERSION, buf);

    /* Read #base phones, #triphones, #senone mappings defined in header */
    n_ci = -1;
    n_tri = -1;
    n_map = -1;
    m->n_ci_sen = -1;
    m->n_sen = -1;
    m->n_tmat = -1;
    do {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Incomplete header\n");

        if ((sscanf(buf, "%d %s", &n, tag) != 2) || (n < 0))
            E_FATAL("Error in header: %s\n", buf);

        if (strcmp(tag, "n_base") == 0)
            n_ci = n;
        else if (strcmp(tag, "n_tri") == 0)
            n_tri = n;
        else if (strcmp(tag, "n_state_map") == 0)
            n_map = n;
        else if (strcmp(tag, "n_tied_ci_state") == 0)
            m->n_ci_sen = n;
        else if (strcmp(tag, "n_tied_state") == 0)
            m->n_sen = n;
        else if (strcmp(tag, "n_tied_tmat") == 0)
            m->n_tmat = n;
        else
            E_FATAL("Unknown header line: %s\n", buf);
    } while ((n_ci < 0) || (n_tri < 0) || (n_map < 0) ||
             (m->n_ci_sen < 0) || (m->n_sen < 0) || (m->n_tmat < 0));

    if ((n_ci == 0) || (m->n_ci_sen == 0) || (m->n_tmat == 0)
        || (m->n_ci_sen > m->n_sen))
        E_FATAL("%s: Error in header\n", mdeffile);

    /* Check typesize limits */
    if (n_ci >= MAX_S3CIPID)
        E_FATAL("%s: #CI phones (%d) exceeds limit (%d)\n", mdeffile, n_ci,
                MAX_S3CIPID);
    if (n_ci + n_tri >= MAX_S3PID)
        E_FATAL("%s: #Phones (%d) exceeds limit (%d)\n", mdeffile,
                n_ci + n_tri, MAX_S3PID);
    if (m->n_sen >= MAX_S3SENID)
        E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", mdeffile,
                m->n_sen, MAX_S3SENID);
    if (m->n_tmat >= MAX_S3TMATID)
        E_FATAL("%s: #tmats (%d) exceeds limit (%d)\n", mdeffile,
                m->n_tmat, MAX_S3TMATID);

    m->n_emit_state = (n_map / (n_ci + n_tri)) - 1;
    if ((m->n_emit_state + 1) * (n_ci + n_tri) != n_map)
        E_FATAL
            ("Header error: n_state_map not a multiple of n_ci*n_tri\n");

    /* Initialize ciphone info */
    m->n_ciphone = n_ci;
    m->ciphone_ht = hash_table_new(n_ci, HASH_CASE_YES);  /* With case-insensitive string names *//* freed in mdef_free */
    m->ciphone = (ciphone_t *) ckd_calloc(n_ci, sizeof(ciphone_t));     /* freed in mdef_free */

    /* Initialize phones info (ciphones + triphones) */
    m->n_phone = n_ci + n_tri;
    m->phone = (phone_t *) ckd_calloc(m->n_phone, sizeof(phone_t));     /* freed in mdef_free */

    /* Allocate space for state->senone map for each phone */
    senmap = (s3senid_t **) ckd_calloc_2d(m->n_phone, m->n_emit_state, sizeof(s3senid_t));      /* freed in mdef_free */
    m->sseq = senmap;           /* TEMPORARY; until it is compressed into just the unique ones */


    /**CODE DUPLICATION!*****************************************************************************************************/
    /* Flat decoder-specific */
    /* Allocate space for state->senone map for each phone */

    /* ARCHAN 20040820, this sacrifice readability and may cause pointer
       problems in future. However, this is a less evil than
       duplication of code.  This is trick point all the state mapping
       to the global mapping and avoid duplicated memory.  
     */

    /* S3 xwdpid_compress will compress the below list phone list. 
     */

    /* ARCHAN, this part should not be used when one of the recognizer is used. */
    m->st2senmap =
        (s3senid_t *) ckd_calloc(m->n_phone * m->n_emit_state,
                                 sizeof(s3senid_t));
    for (p = 0; p < m->n_phone; p++)
        m->phone[p].state = m->st2senmap + (p * m->n_emit_state);
    /******************************************************************************************************/


    /* Allocate initial space for <ci,lc,rc,wpos> -> pid mapping */
    m->wpos_ci_lclist = (ph_lc_t ***) ckd_calloc_2d(N_WORD_POSN, m->n_ciphone, sizeof(ph_lc_t *));      /* freed in mdef_free */

    /*
     * Read base phones and triphones.  They'll simply be assigned a running sequence
     * number as their "phone-id".  If the phone-id < n_ci, it's a ciphone.
     */

    /* Read base phones */
    for (p = 0; p < n_ci; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading CIphone %d\n", p);
        parse_base_line(m, buf, p);
    }
    m->sil = mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    /* Read triphones, if any */
    for (; p < m->n_phone; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading phone %d\n", p);
        parse_tri_line(m, buf, p);
    }

    if (noncomment_line(buf, sizeof(buf), fp) >= 0)
        E_ERROR("Non-empty file beyond expected #phones (%d)\n",
                m->n_phone);

    /* Build CD senones to CI senones map */
    if (m->n_ciphone * m->n_emit_state != m->n_ci_sen)
        E_FATAL
            ("#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
             m->n_ci_sen, m->n_ciphone, m->n_emit_state);
    m->cd2cisen = (s3senid_t *) ckd_calloc(m->n_sen, sizeof(s3senid_t));        /* freed in mdef_free */

    m->sen2cimap = (s3cipid_t *) ckd_calloc(m->n_sen, sizeof(s3cipid_t));       /* freed in mdef_free */

    for (s = 0; s < m->n_sen; s++)
        m->sen2cimap[s] = BAD_S3CIPID;
    for (s = 0; s < m->n_ci_sen; s++) { /* CI senones */
        m->cd2cisen[s] = (s3senid_t) s;
        m->sen2cimap[s] = s / m->n_emit_state;
    }
    for (p = n_ci; p < m->n_phone; p++) {       /* CD senones */
        for (s = 0; s < m->n_emit_state; s++) {
            cd = m->sseq[p][s];
            ci = m->sseq[(int) m->phone[p].ci][s];
            m->cd2cisen[cd] = (s3senid_t) ci;
            m->sen2cimap[cd] = m->phone[p].ci;
        }
    }

    sseq_compress(m);
    fclose(fp);

    return m;
}